

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall
AsymmetricAlgorithm::verifyInit
          (AsymmetricAlgorithm *this,PublicKey *publicKey,Type mechanism,void *param_3,
          size_t param_4)

{
  size_t param_4_local;
  void *param_3_local;
  Type mechanism_local;
  PublicKey *publicKey_local;
  AsymmetricAlgorithm *this_local;
  bool local_1;
  
  if ((this->currentOperation == NONE) && (publicKey != (PublicKey *)0x0)) {
    this->currentOperation = VERIFY;
    this->currentPublicKey = publicKey;
    this->currentMechanism = mechanism;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AsymmetricAlgorithm::verifyInit(PublicKey* publicKey, const AsymMech::Type mechanism,
				     const void* /* param = NULL */, const size_t /* paramLen = 0 */)
{
	if ((currentOperation != NONE) || (publicKey == NULL))
	{
		return false;
	}

	currentOperation = VERIFY;
	currentPublicKey = publicKey;
	currentMechanism = mechanism;

	return true;
}